

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::Common::DynamicStringPair::copyInto(DynamicStringPair *this,uint8 *buffer)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar1 = (this->key).length;
  if (BigEndian(unsigned_short)::signature != '\x01') {
    if (BigEndian(unsigned_short)::signature == '\x04') {
      uVar1 = uVar1 << 8 | uVar1 >> 8;
    }
    else {
      uVar1 = 0;
    }
  }
  *(ushort *)buffer = uVar1;
  memcpy(buffer + 2,(this->key).data,(ulong)(this->key).length);
  uVar1 = (this->key).length;
  uVar2 = (this->value).length;
  if (BigEndian(unsigned_short)::signature != '\x01') {
    if (BigEndian(unsigned_short)::signature == '\x04') {
      uVar2 = uVar2 << 8 | uVar2 >> 8;
    }
    else {
      uVar2 = 0;
    }
  }
  *(ushort *)(buffer + (ulong)uVar1 + 2) = uVar2;
  memcpy(buffer + (ulong)uVar1 + 4,(this->value).data,(ulong)(this->value).length);
  return (uint)(this->value).length + (uint)uVar1 + 4;
}

Assistant:

uint32 copyInto(uint8 * buffer) const { uint32 o = key.copyInto(buffer); o += value.copyInto(buffer+o); return o; }